

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

vec4 vera::getFaceViewport(int _size,int _faceId)

{
  undefined1 auVar1 [16];
  float fVar2;
  ulong uVar3;
  vec4 vVar4;
  vec4 vVar5;
  
  vVar4.field_2 = (float)_size;
  switch(_faceId) {
  case 0:
    fVar2 = vVar4.field_2 + vVar4.field_2;
    goto LAB_002b1eb7;
  case 1:
    uVar3 = (ulong)(uint)vVar4.field_2 << 0x20;
    break;
  case 2:
    uVar3 = CONCAT44(vVar4.field_2 + vVar4.field_2,vVar4.field_2);
    break;
  case 3:
    uVar3 = (ulong)(uint)vVar4.field_2;
    break;
  case 4:
    vVar4.field_3.w = vVar4.field_2;
    vVar4.field_1.y = vVar4.field_2;
    vVar4.field_0.x = vVar4.field_2;
    return vVar4;
  case 5:
    fVar2 = vVar4.field_2 * 3.0;
LAB_002b1eb7:
    uVar3 = CONCAT44(vVar4.field_2,fVar2);
    break;
  default:
    auVar1._4_4_ = vVar4.field_2;
    auVar1._0_4_ = vVar4.field_2;
    auVar1._8_8_ = 0;
    return (vec4)(auVar1 << 0x40);
  }
  vVar5.field_3.w = vVar4.field_2;
  vVar5.field_2.z = vVar4.field_2;
  vVar5.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar3;
  vVar5.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)(int)(uVar3 >> 0x20);
  return vVar5;
}

Assistant:

glm::vec4 getFaceViewport(int _size, int _faceId) {
    if (_faceId == 0) 
        return glm::vec4((float)_size * 2.0f,   (float)_size,       (float)_size, (float)_size);
    else if (_faceId == 1) 
        return glm::vec4(0.0f,                  (float)_size,       (float)_size, (float)_size);
    else if (_faceId == 2) 
        return glm::vec4((float)_size,          (float)_size * 2.f, (float)_size, (float)_size);
    else if (_faceId == 3) 
        return glm::vec4((float)_size,          0.0f,               (float)_size, (float)_size);
    else if (_faceId == 4) 
        return glm::vec4((float)_size,          (float)_size,       (float)_size, (float)_size);
    else if (_faceId == 5)
        return glm::vec4((float)_size * 3.0f,   (float)_size,       (float)_size, (float)_size);

    return glm::vec4(0.0f, 0.0f, (float)_size, (float)_size);
}